

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
* __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
::operator--(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
             *this)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar6;
  btree_node<phmap::priv::map_params<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_greg7mdp[P]parallel_hashmap_tests_btree_test_cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar7;
  size_type i;
  int iStack_20;
  
  bVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          ::leaf(this->node);
  if ((!bVar4) || (iVar1 = this->position, this->position = iVar1 + -1, iVar1 < 1)) {
    bVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            ::leaf(this->node);
    uVar2 = this->position;
    i = (size_type)uVar2;
    if (bVar4) {
      if (-1 < (int)uVar2) {
        __assert_fail("position <= -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x989,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                     );
      }
      pbVar7 = this->node;
      uVar3 = *(undefined8 *)&this->position;
      while ((int)i < 0) {
        bVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::is_root(this->node);
        if (bVar4) {
          if (-1 < this->position) {
            return this;
          }
          iStack_20 = (int)uVar3;
          this->position = iStack_20;
          this->node = pbVar7;
          return this;
        }
        pbVar6 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::parent(this->node);
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::position(this->node);
        pbVar6 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(pbVar6,(ulong)bVar5);
        if (pbVar6 != this->node) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x98c,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                       );
        }
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::position(this->node);
        this->position = bVar5 - 1;
        pbVar6 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::parent(this->node);
        this->node = pbVar6;
        i = (size_type)(uint)this->position;
      }
    }
    else {
      if ((int)uVar2 < 0) {
        __assert_fail("position >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x994,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, (lambda at /workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20), std::allocator<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                     );
      }
      pbVar7 = this->node;
      do {
        pbVar7 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(pbVar7,i);
        this->node = pbVar7;
        bVar4 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::leaf(pbVar7);
        pbVar7 = this->node;
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc:2166:20),_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(pbVar7);
        i = (size_type)bVar5;
      } while (!bVar4);
      this->position = bVar5 - 1;
    }
  }
  return this;
}

Assistant:

btree_iterator& operator--() {
            decrement();
            return *this;
        }